

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O1

void __thiscall amrex::ClusterList::boxArray(ClusterList *this,BoxArray *ba)

{
  int i;
  const_iterator End;
  _List_node_base *p_Var1;
  
  BoxArray::clear(ba);
  BoxArray::resize(ba,(this->lst).
                      super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
                      _M_node._M_size);
  p_Var1 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)this) {
    i = 0;
    do {
      BoxArray::set(ba,i,*(Box **)&((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                                   (p_Var1 + 1))->
                                   super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>
                   );
      i = i + 1;
      p_Var1 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
               super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (p_Var1 != (_List_node_base *)this);
  }
  return;
}

Assistant:

void
ClusterList::boxArray (BoxArray& ba) const
{
    ba.clear();

    ba.resize(lst.size());

    int i = 0;

    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli, ++i)
    {
        ba.set(i,(*cli)->box());
    }
}